

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_primitive_types.h
# Opt level: O0

duk_ret_t dukglue::types::DukType<std::shared_ptr<DogPrimitive>_>::shared_ptr_finalizer
                    (duk_context *ctx)

{
  shared_ptr<DogPrimitive> *this;
  shared_ptr<DogPrimitive> *ptr;
  duk_context *ctx_local;
  
  duk_get_prop_string(ctx,0,anon_var_dwarf_344d4);
  this = (shared_ptr<DogPrimitive> *)duk_require_pointer(ctx,-1);
  duk_pop(ctx);
  if (this != (shared_ptr<DogPrimitive> *)0x0) {
    if (this != (shared_ptr<DogPrimitive> *)0x0) {
      std::shared_ptr<DogPrimitive>::~shared_ptr(this);
      operator_delete(this,0x10);
    }
    duk_push_undefined(ctx);
    duk_put_prop_string(ctx,0,anon_var_dwarf_344d4);
  }
  return 0;
}

Assistant:

static duk_ret_t shared_ptr_finalizer(duk_context* ctx)
			{
				duk_get_prop_string(ctx, 0, "\xFF" "shared_ptr");
				std::shared_ptr<T>* ptr = (std::shared_ptr<T>*) duk_require_pointer(ctx, -1);
				duk_pop(ctx);  // pop shared_ptr ptr

				if (ptr != NULL) {
					delete ptr;

					// for safety, set the pointer to undefined
					// (finalizers can run multiple times)
					duk_push_undefined(ctx);
					duk_put_prop_string(ctx, 0, "\xFF" "shared_ptr");
				}

				return 0;
			}